

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarEnlarge(Abc_Ntk_t *pNtk,int nFrames,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_00 = Aig_ManFrames(pAig,nFrames,0,1,1,1,(Aig_Obj_t ***)0x0);
    Aig_ManStop(pAig);
    pNtk_local = Abc_NtkFromDarSeqSweep(pNtk,pMan_00);
    Aig_ManStop(pMan_00);
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarEnlarge( Abc_Ntk_t * pNtk, int nFrames, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Aig_ManFrames( pTemp = pMan, nFrames, 0, 1, 1, 1, NULL );
    Aig_ManStop( pTemp );
    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}